

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPlot.cpp
# Opt level: O3

bool __thiscall
SVGChart::PlotDataContainer::CalculateXRange(PlotDataContainer *this,float *outXMin,float *outXMax)

{
  PlotDataBase *this_00;
  int iVar1;
  undefined8 in_RAX;
  long lVar2;
  pointer ppPVar3;
  bool bVar4;
  float theXMax;
  float theXMin;
  undefined8 local_38;
  
  bVar4 = false;
  *outXMin = 0.0;
  *outXMax = 0.0;
  ppPVar3 = (this->mXDataList).
            super__Vector_base<SVGChart::PlotDataBase_*,_std::allocator<SVGChart::PlotDataBase_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppPVar3 !=
      (this->mXDataList).
      super__Vector_base<SVGChart::PlotDataBase_*,_std::allocator<SVGChart::PlotDataBase_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    bVar4 = true;
    local_38 = in_RAX;
    do {
      this_00 = *ppPVar3;
      if (this_00 == (PlotDataBase *)0x0) {
        return false;
      }
      lVar2 = PlotDataBase::GetSize(this_00);
      if (lVar2 != 0) {
        iVar1 = (*this_00->_vptr_PlotDataBase[4])(this_00,(long)&local_38 + 4,&local_38);
        if ((char)iVar1 == '\0') {
          return false;
        }
        if ((float)local_38 < local_38._4_4_) {
          return false;
        }
        if (bVar4) {
          *outXMin = local_38._4_4_;
LAB_00104b48:
          *outXMax = (float)local_38;
        }
        else if (*outXMax <= (float)local_38 && (float)local_38 != *outXMax) goto LAB_00104b48;
        if (local_38._4_4_ < *outXMin) {
          *outXMin = local_38._4_4_;
        }
        bVar4 = false;
      }
      ppPVar3 = ppPVar3 + 1;
    } while (ppPVar3 !=
             (this->mXDataList).
             super__Vector_base<SVGChart::PlotDataBase_*,_std::allocator<SVGChart::PlotDataBase_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
    bVar4 = *outXMax != 0.0;
  }
  return (bool)(*outXMin != 0.0 | bVar4);
}

Assistant:

bool PlotDataContainer::CalculateXRange (float &outXMin, float &outXMax) const {
      bool theFirst = true;
      outXMin = 0;
      outXMax = 0;
      for (PlotDataList::const_iterator theI=mXDataList.begin();theI!=mXDataList.end ();theI++) {
        PlotDataBase *theXDataBase = *theI;
        if (!theXDataBase) {
          return false;
        }
        if (theXDataBase->GetSize () == 0) {
            continue;
        }
        float theXMin;
        float theXMax;
        if (!theXDataBase->CalculateRange (theXMin, theXMax)) {
          return false;
        }
        if (theXMax < theXMin) {
            return false;
        }
        if (theFirst) {
          outXMin = theXMin;
          outXMax = theXMax;
          theFirst = false;
        }
        if (theXMax>outXMax) {
          outXMax = theXMax;
        }
        if (theXMin<outXMin) {
          outXMin = theXMin;
        }
      }
      if (outXMin == 0 && outXMax == 0) {
          return false;
      }
      return true;
    }